

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

bool __thiscall AixLog::Filter::match(Filter *this,Metadata *metadata)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  const_iterator cVar3;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  if ((this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar2 = true;
  }
  else {
    cVar3 = std::
            _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
            ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                    *)this,&metadata->tag);
    p_Var1 = &(this->tag_filter_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
      local_60 = (undefined1  [8])&PTR__Tag_001edee0;
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"*","");
      local_38 = false;
      cVar3 = std::
              _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
              ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                      *)this,(key_type *)local_60);
      local_60 = (undefined1  [8])&PTR__Tag_001edee0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar3._M_node == p_Var1) {
        return false;
      }
    }
    bVar2 = *(char *)&cVar3._M_node[2]._M_left <= (char)metadata->severity;
  }
  return bVar2;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}